

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsfil.cpp
# Opt level: O0

CTcSymbol * CTcSymbolBase::read_from_sym_file(CVmFile *fp)

{
  uint uVar1;
  tc_symtype_t typ;
  CVmFile *in_stack_00000038;
  CVmFile *in_stack_00000058;
  CVmFile *in_stack_000000b8;
  CVmFile *in_stack_00000138;
  CVmFile *in_stack_00001060;
  CVmFile *in_stack_ffffffffffffffe0;
  CTcSymbol *local_8;
  
  uVar1 = CVmFile::read_uint2(in_stack_ffffffffffffffe0);
  switch(uVar1) {
  case 1:
    local_8 = CTcSymFuncBase::read_from_sym_file(in_stack_00001060);
    break;
  case 2:
    local_8 = CTcSymObjBase::read_from_sym_file(in_stack_000000b8);
    break;
  case 3:
    local_8 = CTcSymPropBase::read_from_sym_file(in_stack_00000038);
    break;
  default:
    CTcMain::log_error(G_tcmain,(CTcTokFileDesc *)0x0,0,TC_SEV_ERROR,0x2db4);
    local_8 = (CTcSymbol *)0x0;
    break;
  case 9:
    local_8 = CTcSymMetaclassBase::read_from_sym_file(in_stack_00000138);
    break;
  case 10:
    local_8 = CTcSymEnumBase::read_from_sym_file(in_stack_00000058);
  }
  return local_8;
}

Assistant:

CTcSymbol *CTcSymbolBase::read_from_sym_file(CVmFile *fp)
{
    /* 
     *   read the type - this is the one thing we know is always present for
     *   every symbol (the rest of the data might vary per subclass) 
     */
    tc_symtype_t typ = (tc_symtype_t)fp->read_uint2();

    /* create the object based on the type */
    switch(typ)
    {
    case TC_SYM_FUNC:
        return CTcSymFunc::read_from_sym_file(fp);

    case TC_SYM_OBJ:
        return CTcSymObj::read_from_sym_file(fp);

    case TC_SYM_PROP:
        return CTcSymProp::read_from_sym_file(fp);

    case TC_SYM_ENUM:
        return CTcSymEnum::read_from_sym_file(fp);

    case TC_SYM_METACLASS:
        return CTcSymMetaclass::read_from_sym_file(fp);

    default:
        /* other types should not be in a symbol file */
        G_tcmain->log_error(0, 0, TC_SEV_ERROR, TCERR_SYMEXP_INV_TYPE);
        return 0;
    }
}